

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O1

int testSpanTestsIteratorImmutableExplicitBeginEnd(void)

{
  int *piVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  int local_28 [4];
  
  local_28[0] = 1;
  local_28[1] = 2;
  local_28[2] = 3;
  local_28[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_41);
  iVar6 = 0;
  lVar2 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  bVar8 = lVar2 == 0;
  if (!bVar8) {
    lVar7 = 1;
    if (*local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start == 1) {
      lVar4 = 1;
      do {
        lVar2 = lVar2 + -4;
        bVar8 = lVar2 == 0;
        if (bVar8) {
          iVar6 = (int)lVar4;
          goto LAB_001cb3d4;
        }
        lVar7 = lVar4 + 1;
        piVar1 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar4;
        lVar4 = lVar7;
      } while ((int)lVar7 == *piVar1);
    }
    iVar6 = (int)lVar7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x133);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(*itr) == (++counter)",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
LAB_001cb3d4:
  iVar5 = 1;
  if ((bVar8) && (iVar5 = 0, iVar6 != 4)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x135);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(counter) == (4)",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    iVar5 = 1;
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int testSpanTestsIteratorImmutableExplicitBeginEnd()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    int counter = 0;
    for (auto itr = span.begin(); itr != span.end(); ++itr) {
        static_assert(std::is_same<decltype(*itr), const int&>::value, "iterator must be const");
        ML_ASSERT_EQ(*itr, ++counter);
    }
    ML_ASSERT_EQ(counter, 4);

    return 0;
}